

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::anon_unknown_1::Variable::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,Variable *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  char *__rhs;
  VarType type;
  string traversedName;
  VarType local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __rhs = "";
  if (numArrayElements < 0) {
    __rhs = "[gl_InvocationID]";
  }
  std::operator+(&local_48,&this->m_name,__rhs);
  if (numArrayElements < 0) {
    glu::VarType::VarType(&local_60,&this->m_type);
  }
  else {
    glu::VarType::VarType(&local_60,&this->m_type,numArrayElements);
  }
  glslTraverseBasicTypes(__return_storage_ptr__,&local_48,&local_60,0,indentationDepth,visit);
  glu::VarType::~VarType(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::glslTraverseBasicTypeArray (const int numArrayElements, const int indentationDepth, BasicTypeVisitFunc visit) const
{
	DE_ASSERT(m_isArray);

	const bool			traverseAsArray	= numArrayElements >= 0;
	const std::string	traversedName	= m_name + (!traverseAsArray ? "[gl_InvocationID]" : "");
	const glu::VarType	type			= traverseAsArray ? glu::VarType(m_type, numArrayElements) : m_type;

	return glslTraverseBasicTypes(traversedName, type, 0, indentationDepth, visit);
}